

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

void Ivy_ManPrintVerbose(Ivy_Man_t *p,int fHaig)

{
  int i;
  uint *puVar1;
  Vec_Int_t *p_00;
  Ivy_Obj_t *pObj;
  char *pcVar2;
  int iVar3;
  Ivy_Man_t *p_01;
  
  printf("PIs: ");
  for (iVar3 = 0; iVar3 < p->vPis->nSize; iVar3 = iVar3 + 1) {
    Vec_PtrEntry(p->vPis,iVar3);
    printf(" %d");
  }
  putchar(10);
  printf("POs: ");
  for (iVar3 = 0; iVar3 < p->vPos->nSize; iVar3 = iVar3 + 1) {
    Vec_PtrEntry(p->vPos,iVar3);
    printf(" %d");
  }
  putchar(10);
  printf("Latches: ");
  for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
    puVar1 = (uint *)Vec_PtrEntry(p->vObjs,iVar3);
    if ((puVar1 != (uint *)0x0) && ((puVar1[2] & 0xf) == 4)) {
      pcVar2 = "\'";
      if ((*(ulong *)(puVar1 + 4) & 1) == 0) {
        pcVar2 = " ";
      }
      printf(" %d=%d%s",(ulong)*puVar1,(ulong)*(uint *)(*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe)
             ,pcVar2);
    }
  }
  putchar(10);
  p_00 = Ivy_ManDfsSeq(p,(Vec_Int_t **)0x0);
  for (iVar3 = 0; iVar3 < p_00->nSize; iVar3 = iVar3 + 1) {
    i = Vec_IntEntry(p_00,iVar3);
    p_01 = p;
    pObj = Ivy_ManObj(p,i);
    if (pObj == (Ivy_Obj_t *)0x0) break;
    Ivy_ObjPrintVerbose(p_01,pObj,fHaig);
    putchar(10);
  }
  putchar(10);
  free(p_00->pArray);
  free(p_00);
  return;
}

Assistant:

void Ivy_ManPrintVerbose( Ivy_Man_t * p, int fHaig )
{
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    printf( "PIs: " );
    Ivy_ManForEachPi( p, pObj, i )
        printf( " %d", pObj->Id );
    printf( "\n" );
    printf( "POs: " );
    Ivy_ManForEachPo( p, pObj, i )
        printf( " %d", pObj->Id );
    printf( "\n" );
    printf( "Latches: " );
    Ivy_ManForEachLatch( p, pObj, i )
        printf( " %d=%d%s", pObj->Id, Ivy_ObjFanin0(pObj)->Id, (Ivy_ObjFaninC0(pObj)? "\'" : " ") );
    printf( "\n" );
    vNodes = Ivy_ManDfsSeq( p, NULL );
    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        Ivy_ObjPrintVerbose( p, pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_IntFree( vNodes );
}